

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

void __thiscall QFileSystemMetaData::fillFromDirEnt(QFileSystemMetaData *this,dirent64 *entry)

{
  long lVar1;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> QVar2;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> QVar3;
  QFileSystemMetaData *this_00;
  long in_RSI;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> *in_RDI;
  long in_FS_OFFSET;
  MetaDataFlag flags;
  enum_type f2;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_5c;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> local_58;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileSystemMetaData *)(ulong)*(byte *)(in_RSI + 0x12);
  if ((QFileSystemMetaData *)0xc < this_00) goto switchD_0020f3da_caseD_3;
  f2 = (enum_type)*(byte *)(in_RSI + 0x12);
  flags = (MetaDataFlag)((ulong)in_RDI >> 0x20);
  switch(this_00) {
  case (QFileSystemMetaData *)0x0:
  default:
switchD_0020f3da_caseD_3:
    clear(this_00);
    break;
  case (QFileSystemMetaData *)0x1:
  case (QFileSystemMetaData *)0x2:
  case (QFileSystemMetaData *)0xc:
    ::operator|(AliasType,f2);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QVar2.i = (Int)QFlags<QFileSystemMetaData::MetaDataFlag>::operator|
                             (&this_00->knownFlagsMask,flags);
    in_RDI->i = QVar2.i;
    QVar3.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
         ::operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
    in_RDI[1].i = (Int)QVar3.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
    break;
  case (QFileSystemMetaData *)0x4:
    ::operator|(AliasType,f2);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QVar2.i = (Int)QFlags<QFileSystemMetaData::MetaDataFlag>::operator|
                             (&this_00->knownFlagsMask,flags);
    in_RDI->i = QVar2.i;
    QVar3.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
         ::operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
    in_RDI[1].i = (Int)QVar3.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
    break;
  case (QFileSystemMetaData *)0x6:
    ::operator|(AliasType,f2);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QVar2.i = (Int)QFlags<QFileSystemMetaData::MetaDataFlag>::operator|
                             (&this_00->knownFlagsMask,flags);
    in_RDI->i = QVar2.i;
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags(&this_00->knownFlagsMask,flags);
    in_RDI[1].i = (Int)local_38.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
    break;
  case (QFileSystemMetaData *)0x8:
    ::operator|(AliasType,f2);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|(&this_00->knownFlagsMask,flags);
    QVar2.i = (Int)QFlags<QFileSystemMetaData::MetaDataFlag>::operator|
                             (&this_00->knownFlagsMask,flags);
    in_RDI->i = QVar2.i;
    QVar3.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
         ::operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
    in_RDI[1].i = (Int)QVar3.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
    break;
  case (QFileSystemMetaData *)0xa:
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)this_00,flags);
    in_RDI->i = local_58.i;
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags(&this_00->knownFlagsMask,flags);
    in_RDI[1].i = (Int)local_5c.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemMetaData::fillFromDirEnt(const QT_DIRENT &entry)
{
#if defined(_DEXTRA_FIRST)
    knownFlagsMask = {};
    entryFlags = {};
    for (dirent_extra *extra = _DEXTRA_FIRST(&entry); _DEXTRA_VALID(extra, &entry);
         extra = _DEXTRA_NEXT(extra)) {
        if (extra->d_type == _DTYPE_STAT || extra->d_type == _DTYPE_LSTAT) {

            const struct dirent_extra_stat * const extra_stat =
                    reinterpret_cast<struct dirent_extra_stat *>(extra);

            // Remember whether this was a link or not, this saves an lstat() call later.
            if (extra->d_type == _DTYPE_LSTAT) {
                knownFlagsMask |= QFileSystemMetaData::LinkType;
                if (S_ISLNK(extra_stat->d_stat.st_mode))
                    entryFlags |= QFileSystemMetaData::LinkType;
            }

            // For symlinks, the extra type _DTYPE_LSTAT doesn't work for filling out the meta data,
            // as we need the stat() information there, not the lstat() information.
            // In this case, don't use the extra information.
            // Unfortunately, readdir() never seems to return extra info of type _DTYPE_STAT, so for
            // symlinks, we always incur the cost of an extra stat() call later.
            if (S_ISLNK(extra_stat->d_stat.st_mode) && extra->d_type == _DTYPE_LSTAT)
                continue;

#if defined(QT_USE_XOPEN_LFS_EXTENSIONS) && defined(QT_LARGEFILE_SUPPORT)
            // Even with large file support, d_stat is always of type struct stat, not struct stat64,
            // so it needs to be converted
            struct stat64 statBuf;
            fillStat64fromStat32(&statBuf, extra_stat->d_stat);
            fillFromStatBuf(statBuf);
#else
            fillFromStatBuf(extra_stat->d_stat);
#endif
            knownFlagsMask |= QFileSystemMetaData::PosixStatFlags;
            if (!S_ISLNK(extra_stat->d_stat.st_mode)) {
                knownFlagsMask |= QFileSystemMetaData::ExistsAttribute;
                entryFlags |= QFileSystemMetaData::ExistsAttribute;
            }
        }
    }
#elif defined(_DIRENT_HAVE_D_TYPE) || defined(Q_OS_BSD4)
    // BSD4 includes OS X and iOS

    // ### This will clear all entry flags and knownFlagsMask
    switch (entry.d_type)
    {
    case DT_DIR:
        knownFlagsMask = QFileSystemMetaData::LinkType
            | QFileSystemMetaData::FileType
            | QFileSystemMetaData::DirectoryType
            | QFileSystemMetaData::SequentialType
            | QFileSystemMetaData::ExistsAttribute;

        entryFlags = QFileSystemMetaData::DirectoryType
            | QFileSystemMetaData::ExistsAttribute;

        break;

    case DT_BLK:
        knownFlagsMask = QFileSystemMetaData::LinkType
            | QFileSystemMetaData::FileType
            | QFileSystemMetaData::DirectoryType
            | QFileSystemMetaData::BundleType
            | QFileSystemMetaData::AliasType
            | QFileSystemMetaData::SequentialType
            | QFileSystemMetaData::ExistsAttribute;

        entryFlags = QFileSystemMetaData::ExistsAttribute;

        break;

    case DT_CHR:
    case DT_FIFO:
    case DT_SOCK:
        // ### System attribute
        knownFlagsMask = QFileSystemMetaData::LinkType
            | QFileSystemMetaData::FileType
            | QFileSystemMetaData::DirectoryType
            | QFileSystemMetaData::BundleType
            | QFileSystemMetaData::AliasType
            | QFileSystemMetaData::SequentialType
            | QFileSystemMetaData::ExistsAttribute;

        entryFlags = QFileSystemMetaData::SequentialType
            | QFileSystemMetaData::ExistsAttribute;

        break;

    case DT_LNK:
        knownFlagsMask = QFileSystemMetaData::LinkType;
        entryFlags = QFileSystemMetaData::LinkType;
        break;

    case DT_REG:
        knownFlagsMask = QFileSystemMetaData::LinkType
            | QFileSystemMetaData::FileType
            | QFileSystemMetaData::DirectoryType
            | QFileSystemMetaData::BundleType
            | QFileSystemMetaData::SequentialType
            | QFileSystemMetaData::ExistsAttribute;

        entryFlags = QFileSystemMetaData::FileType
            | QFileSystemMetaData::ExistsAttribute;

        break;

    case DT_UNKNOWN:
    default:
        clear();
    }
#else
    Q_UNUSED(entry);
#endif
}